

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBitString.h
# Opt level: O1

void __thiscall jbcoin::STBitString<256UL>::add(STBitString<256UL> *this,Serializer *s)

{
  SField *pSVar1;
  
  pSVar1 = (this->super_STBase).fName;
  if (0xff < pSVar1->fieldValue) {
    __assert_fail("fName->isBinary ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STBitString.h"
                  ,0x60,"virtual void jbcoin::STBitString<256>::add(Serializer &) const");
  }
  if (pSVar1->fieldType == STI_HASH256) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)s,
               (s->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,&this->value_,this + 1);
    return;
  }
  __assert_fail("fName->fieldType == getSType()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STBitString.h"
                ,0x61,"virtual void jbcoin::STBitString<256>::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == getSType());
        s.addBitString<Bits> (value_);
    }